

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_23::insertChannels
               (Header *header,RgbaChannels rgbaChannels,char *fileName)

{
  ostream *poVar1;
  ArgExc *this;
  ChannelList *this_00;
  char *in_RDX;
  uint in_ESI;
  Channel *in_stack_00000050;
  char *in_stack_00000058;
  ChannelList *in_stack_00000060;
  stringstream _iex_throw_s;
  ChannelList ch;
  ChannelList *in_stack_fffffffffffffda8;
  Channel local_230;
  Channel local_220;
  Channel local_210;
  Channel local_200;
  stringstream local_1f0 [16];
  ostream local_1e0 [392];
  Channel local_58 [4];
  char *local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  ChannelList::ChannelList((ChannelList *)0x24b2db);
  if ((local_c & 0x30) == 0) {
    if ((local_c & 1) != 0) {
      Channel::Channel(&local_200,HALF,1,1,false);
      ChannelList::insert(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
    if ((local_c & 2) != 0) {
      Channel::Channel(&local_210,HALF,1,1,false);
      ChannelList::insert(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
    if ((local_c & 4) != 0) {
      Channel::Channel(&local_220,HALF,1,1,false);
      ChannelList::insert(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
  }
  else {
    if ((local_c & 0x10) != 0) {
      Channel::Channel(local_58,HALF,1,1,false);
      ChannelList::insert(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
    if ((local_c & 0x20) != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar1 = std::operator<<(local_1e0,"Cannot open file \"");
      poVar1 = std::operator<<(poVar1,local_18);
      std::operator<<(poVar1,
                      "\" for writing.  Tiled image files do not support subsampled chroma channels."
                     );
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,local_1f0);
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  if ((local_c & 8) != 0) {
    Channel::Channel(&local_230,HALF,1,1,false);
    ChannelList::insert(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  this_00 = Header::channels((Header *)0x24b562);
  ChannelList::operator=(this_00,in_stack_fffffffffffffda8);
  ChannelList::~ChannelList((ChannelList *)0x24b58a);
  return;
}

Assistant:

void
insertChannels (
    Header& header, RgbaChannels rgbaChannels, const char fileName[])
{
    ChannelList ch;

    if (rgbaChannels & (WRITE_Y | WRITE_C))
    {
        if (rgbaChannels & WRITE_Y) { ch.insert ("Y", Channel (HALF, 1, 1)); }

        if (rgbaChannels & WRITE_C)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Cannot open file \""
                    << fileName
                    << "\" "
                       "for writing.  Tiled image files do not "
                       "support subsampled chroma channels.");
        }
    }
    else
    {
        if (rgbaChannels & WRITE_R) ch.insert ("R", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_G) ch.insert ("G", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_B) ch.insert ("B", Channel (HALF, 1, 1));
    }

    if (rgbaChannels & WRITE_A) ch.insert ("A", Channel (HALF, 1, 1));

    header.channels () = ch;
}